

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-test.c++
# Opt level: O2

Own<kj::File> kj::anon_unknown_0::newTempFile(void)

{
  int osErrorNumber;
  File *extraout_RDX;
  kj *in_RDI;
  Own<kj::File> OVar1;
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_filesystem_disk_test_c__:213:3)>
  _kjDefer213;
  char filename [35];
  AutoCloseFd local_60;
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_filesystem_disk_test_c__:213:3)>
  local_58;
  char local_48 [48];
  
  builtin_strncpy(local_48,"/var/tmp/kj-filesystem-test.XXXXXX",0x23);
  do {
    local_60.fd = mkstemp(local_48);
    if (-1 < local_60.fd) goto LAB_0025634f;
    osErrorNumber = _::Debug::getOsErrorNumber(false);
  } while (osErrorNumber == -1);
  if (osErrorNumber != 0) {
    _::Debug::Fault::Fault
              ((Fault *)&local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0xd4,osErrorNumber,"fd = mkstemp(filename)","");
    _::Debug::Fault::fatal((Fault *)&local_58);
  }
LAB_0025634f:
  local_58.canceled = false;
  local_58.func.filename = (char (*) [35])local_48;
  UnwindDetector::UnwindDetector(&local_60.unwindDetector);
  newDiskFile(in_RDI,&local_60);
  AutoCloseFd::~AutoCloseFd(&local_60);
  _::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-test.c++:213:3)>
  ::~Deferred(&local_58);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)in_RDI;
  return OVar1;
}

Assistant:

static Own<File> newTempFile() {
  char filename[] = VAR_TMP "/kj-filesystem-test.XXXXXX";
  int fd;
  KJ_SYSCALL(fd = mkstemp(filename));
  KJ_DEFER(KJ_SYSCALL(unlink(filename)));
  return newDiskFile(AutoCloseFd(fd));
}